

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Lms_Man_t * Lms_ManStart(Gia_Man_t *pGia,int nVars,int nCuts,int fFuncOnly,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Lms_Man_t *pLVar3;
  Vec_Mem_t *pVVar4;
  Vec_Int_t *pVVar5;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  word *pEntry;
  abctime aVar8;
  Vec_Ptr_t *pVVar9;
  abctime aVar10;
  bool bVar11;
  int local_68;
  int local_64;
  int Prev;
  int Index;
  int i_1;
  word *pTruth;
  Gia_Obj_t *pObj;
  int i;
  abctime clk2;
  abctime clk;
  Lms_Man_t *p;
  int fVerbose_local;
  int fFuncOnly_local;
  int nCuts_local;
  int nVars_local;
  Gia_Man_t *pGia_local;
  
  aVar2 = Abc_Clock();
  local_68 = nVars;
  if (pGia != (Gia_Man_t *)0x0) {
    local_68 = Gia_ManCiNum(pGia);
  }
  if ((5 < local_68) && (local_68 < 0x11)) {
    pLVar3 = (Lms_Man_t *)calloc(1,0x40d8);
    pLVar3->nVars = local_68;
    pLVar3->nCuts = nCuts;
    iVar1 = Abc_Truth6WordNum(local_68);
    pLVar3->nWords = iVar1;
    pLVar3->fFuncOnly = fFuncOnly;
    pVVar4 = Vec_MemAlloc(pLVar3->nWords,0xc);
    pLVar3->vTtMem = pVVar4;
    Vec_MemHashAlloc(pLVar3->vTtMem,10000);
    if (fFuncOnly == 0) {
      pVVar5 = Vec_IntAlloc(10000);
      pLVar3->vTruthIds = pVVar5;
      if (pGia == (Gia_Man_t *)0x0) {
        pGVar6 = Gia_ManStart(10000);
        pLVar3->pGia = pGVar6;
        pcVar7 = Abc_UtilStrsav("record");
        pLVar3->pGia->pName = pcVar7;
        for (pObj._4_4_ = 0; pObj._4_4_ < local_68; pObj._4_4_ = pObj._4_4_ + 1) {
          Gia_ManAppendCi(pLVar3->pGia);
        }
      }
      else {
        local_64 = -1;
        pLVar3->pGia = pGia;
        iVar1 = Gia_ManCoNum(pLVar3->pGia);
        pLVar3->nAdded = iVar1;
        Prev = 0;
        while( true ) {
          iVar1 = Vec_IntSize(pLVar3->pGia->vCos);
          bVar11 = false;
          if (Prev < iVar1) {
            pTruth = (word *)Gia_ManCo(pLVar3->pGia,Prev);
            bVar11 = (Gia_Obj_t *)pTruth != (Gia_Obj_t *)0x0;
          }
          if (!bVar11) break;
          aVar10 = Abc_Clock();
          pEntry = Gia_ObjComputeTruthTable(pLVar3->pGia,(Gia_Obj_t *)pTruth);
          aVar8 = Abc_Clock();
          pLVar3->timeTruth = (aVar8 - aVar10) + pLVar3->timeTruth;
          aVar10 = Abc_Clock();
          iVar1 = Vec_MemHashInsert(pLVar3->vTtMem,pEntry);
          aVar8 = Abc_Clock();
          pLVar3->timeInsert = (aVar8 - aVar10) + pLVar3->timeInsert;
          if ((iVar1 != local_64) && (iVar1 != local_64 + 1)) {
            __assert_fail("Index == Prev || Index == Prev + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                          ,0x15f,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
          }
          Vec_IntPush(pLVar3->vTruthIds,iVar1);
          Prev = Prev + 1;
          local_64 = iVar1;
        }
      }
      pVVar9 = Vec_PtrAlloc(1000);
      pLVar3->vNodes = pVVar9;
      pVVar9 = Vec_PtrAlloc(1000);
      pLVar3->vLabelsP = pVVar9;
      pVVar5 = Vec_IntAlloc(1000);
      pLVar3->vLabels = pVVar5;
      aVar10 = Abc_Clock();
      pLVar3->timeTotal = (aVar10 - aVar2) + pLVar3->timeTotal;
    }
    return pLVar3;
  }
  __assert_fail("nVars >= 6 && nVars <= LMS_VAR_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                ,0x137,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Lms_Man_t * Lms_ManStart( Gia_Man_t * pGia, int nVars, int nCuts, int fFuncOnly, int fVerbose )
{
    Lms_Man_t * p;
    abctime clk, clk2 = Abc_Clock();
    // if GIA is given, use the number of variables from GIA
    nVars = pGia ? Gia_ManCiNum(pGia) : nVars;
    assert( nVars >= 6 && nVars <= LMS_VAR_MAX );
    // allocate manager
    p = ABC_CALLOC( Lms_Man_t, 1 );
    // parameters
    p->nVars = nVars;
    p->nCuts = nCuts;
    p->nWords = Abc_Truth6WordNum( nVars );
    p->fFuncOnly = fFuncOnly;
    // internal data for library construction
    p->vTtMem = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
//    p->vTtMem2 = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
    Vec_MemHashAlloc( p->vTtMem, 10000 );
//    Vec_MemHashAlloc( p->vTtMem2, 10000 );
    if ( fFuncOnly )
        return p;    
    p->vTruthIds = Vec_IntAlloc( 10000 );
    if ( pGia == NULL )
    {
        int i;
        p->pGia = Gia_ManStart( 10000 );
        p->pGia->pName = Abc_UtilStrsav( "record" );
        for ( i = 0; i < nVars; i++ )
            Gia_ManAppendCi( p->pGia );
    }
    else
    {
        Gia_Obj_t * pObj;
        word * pTruth;
        int i, Index, Prev = -1;
        p->pGia = pGia;
        // populate the manager with subgraphs present in GIA
        p->nAdded = Gia_ManCoNum( p->pGia );
        Gia_ManForEachCo( p->pGia, pObj, i )
        {
            clk = Abc_Clock();
            pTruth = Gia_ObjComputeTruthTable( p->pGia, pObj );
            p->timeTruth += Abc_Clock() - clk;
            clk = Abc_Clock();
            Index = Vec_MemHashInsert( p->vTtMem, pTruth );
            p->timeInsert += Abc_Clock() - clk;
            assert( Index == Prev || Index == Prev + 1 ); // GIA subgraphs should be ordered
            Vec_IntPush( p->vTruthIds, Index );
            Prev = Index;
        }
    }
    // temporaries
    p->vNodes    = Vec_PtrAlloc( 1000 );
    p->vLabelsP  = Vec_PtrAlloc( 1000 );
    p->vLabels   = Vec_IntAlloc( 1000 );
p->timeTotal += Abc_Clock() - clk2;
    return p;    
}